

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  secp256k1_scalar *in_RCX;
  uchar *keypair;
  secp256k1_musig_aggnonce *nonce;
  void *__s;
  bool bVar11;
  uint uVar12;
  secp256k1_context *psVar13;
  secp256k1_ge *psVar14;
  secp256k1_fe *psVar15;
  secp256k1_keyagg_cache_internal *cache_i;
  secp256k1_context *psVar16;
  secp256k1_scalar *psVar17;
  uint64_t *puVar18;
  secp256k1_context *psVar19;
  secp256k1_musig_keyagg_cache *in_R8;
  secp256k1_musig_session *in_R9;
  secp256k1_context *unaff_R12;
  long lVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  secp256k1_fe u;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  secp256k1_fe *psStack_628;
  uint uStack_620;
  uint uStack_61c;
  undefined1 auStack_618 [96];
  secp256k1_fe sStack_5b8;
  secp256k1_ge sStack_580;
  secp256k1_keyagg_cache_internal sStack_518;
  secp256k1_context *psStack_420;
  secp256k1_gej *psStack_418;
  uchar *puStack_410;
  secp256k1_scalar *psStack_408;
  secp256k1_context *psStack_400;
  code *pcStack_3f8;
  uint uStack_3f0;
  uint64_t uStack_3ec;
  uint64_t uStack_3e4;
  uint64_t uStack_3dc;
  uint64_t uStack_3d4;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 auStack_3c0 [64];
  byte abStack_380 [32];
  undefined1 auStack_360 [92];
  int iStack_304;
  int iStack_300;
  undefined1 auStack_2f8 [92];
  int iStack_29c;
  uint uStack_208;
  secp256k1_ge sStack_200;
  secp256k1_ge sStack_198;
  secp256k1_gej sStack_130;
  secp256k1_ge *psStack_98;
  secp256k1_context *psStack_90;
  long lStack_88;
  secp256k1_gej *psStack_80;
  secp256k1_context *psStack_78;
  code *pcStack_70;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  
  bVar21 = 0;
  pcStack_70 = (code *)0x111dae;
  secp256k1_gej_verify(a);
  pcStack_70 = (code *)0x111dba;
  secp256k1_gej_verify(a + 1);
  lVar9 = -1;
  lVar6 = 0;
  bVar7 = true;
  do {
    bVar11 = bVar7;
    lVar20 = lVar6;
    if (a[lVar20].infinity == 0) {
      psVar14 = r + lVar20;
      if (lVar9 == -1) {
        uVar1 = a[lVar20].z.n[0];
        uVar2 = a[lVar20].z.n[1];
        uVar3 = a[lVar20].z.n[2];
        uVar4 = a[lVar20].z.n[3];
        iVar8 = a[lVar20].z.magnitude;
        iVar5 = a[lVar20].z.normalized;
        (psVar14->x).n[4] = a[lVar20].z.n[4];
        (psVar14->x).magnitude = iVar8;
        (psVar14->x).normalized = iVar5;
        (psVar14->x).n[2] = uVar3;
        (psVar14->x).n[3] = uVar4;
        (psVar14->x).n[0] = uVar1;
        (psVar14->x).n[1] = uVar2;
      }
      else {
        pcStack_70 = (code *)0x111e07;
        secp256k1_fe_mul(&psVar14->x,&r[lVar9].x,&a[lVar20].z);
      }
    }
    else {
      pcStack_70 = (code *)0x111de5;
      secp256k1_ge_set_infinity(r + lVar20);
      lVar20 = lVar9;
    }
    lVar9 = lVar20;
    lVar6 = 1;
    bVar7 = false;
  } while (bVar11);
  if (lVar20 == -1) {
    return;
  }
  psVar19 = (secp256k1_context *)(r + lVar20);
  psVar16 = (secp256k1_context *)&stack0xffffffffffffffa0;
  pcStack_70 = (code *)0x111e55;
  psVar13 = psVar19;
  secp256k1_fe_inv_var((secp256k1_fe *)psVar16,(secp256k1_fe *)psVar19);
  if (lVar20 == 0) {
LAB_00111e91:
    lVar20 = 0;
  }
  else if (a->infinity == 0) {
    unaff_R12 = (secp256k1_context *)&stack0xffffffffffffffa0;
    pcStack_70 = (code *)0x111e77;
    secp256k1_fe_mul((secp256k1_fe *)psVar19,&r->x,(secp256k1_fe *)unaff_R12);
    pcStack_70 = (code *)0x111e91;
    psVar13 = unaff_R12;
    psVar16 = unaff_R12;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R12,(secp256k1_fe *)unaff_R12,&a[lVar20].z);
    goto LAB_00111e91;
  }
  if (a[lVar20].infinity == 0) {
    puVar18 = r[lVar20].x.n + 4;
    *puVar18 = local_40;
    puVar18[1] = uStack_38;
    puVar18 = r[lVar20].x.n + 2;
    *puVar18 = local_50;
    puVar18[1] = uStack_48;
    r[lVar20].x.n[0] = local_60;
    r[lVar20].x.n[1] = uStack_58;
    lVar9 = 0;
    bVar7 = true;
    do {
      bVar11 = bVar7;
      if (a[lVar9].infinity == 0) {
        pcStack_70 = (code *)0x111ef0;
        secp256k1_ge_set_gej_zinv(r + lVar9,a + lVar9,&r[lVar9].x);
      }
      lVar9 = 1;
      bVar7 = false;
    } while (bVar11);
    pcStack_70 = (code *)0x111f08;
    secp256k1_ge_verify(r);
    pcStack_70 = (code *)0x111f14;
    secp256k1_ge_verify(r + 1);
    return;
  }
  pcStack_70 = secp256k1_musig_nonce_process;
  secp256k1_ge_set_all_gej_var_cold_1();
  pcStack_70 = (code *)0x0;
  psStack_98 = r;
  psStack_90 = unaff_R12;
  lStack_88 = lVar20;
  psStack_80 = a;
  psStack_78 = psVar19;
  if (psVar16 == (secp256k1_context *)0x0) {
    pcStack_3f8 = (code *)0x1122a3;
    secp256k1_musig_nonce_process_cold_7();
  }
  else if (psVar13 != (secp256k1_context *)0x0) {
    if (nonce == (secp256k1_musig_aggnonce *)0x0) {
      pcStack_3f8 = (code *)0x1122b5;
      secp256k1_musig_nonce_process_cold_5();
      return;
    }
    if (in_RCX == (secp256k1_scalar *)0x0) {
      pcStack_3f8 = (code *)0x1122bf;
      secp256k1_musig_nonce_process_cold_4();
      return;
    }
    if (in_R8 == (secp256k1_musig_keyagg_cache *)0x0) {
      pcStack_3f8 = (code *)0x1122c9;
      secp256k1_musig_nonce_process_cold_3();
      return;
    }
    pcStack_3f8 = (code *)0x111f85;
    iVar8 = secp256k1_keyagg_cache_load
                      (psVar16,(secp256k1_keyagg_cache_internal *)auStack_2f8,in_R8);
    if (iVar8 == 0) {
      return;
    }
    pcStack_3f8 = (code *)0x111fa1;
    secp256k1_fe_get_b32(auStack_3c0 + 0x20,(secp256k1_fe *)auStack_2f8);
    pcStack_3f8 = (code *)0x111fb4;
    iVar8 = secp256k1_musig_aggnonce_load(psVar16,&sStack_200,nonce);
    if (iVar8 == 0) {
      return;
    }
    sStack_130.x.n[0] = 0x6bf7e532c7d5a45;
    sStack_130.x.n[1] = 0x971254c089be68a6;
    sStack_130.x.n[2] = 0x72846dcd60ac12d2;
    sStack_130.x.n[3] = 0xde7a25006c81212f;
    sStack_130.z.n[0] = 0x40;
    pcStack_3f8 = (code *)0x112003;
    secp256k1_musig_ge_serialize_ext(auStack_360,&sStack_200);
    pcStack_3f8 = (code *)0x112013;
    secp256k1_sha256_write((secp256k1_sha256 *)&sStack_130,auStack_360,0x21);
    pcStack_3f8 = (code *)0x112023;
    secp256k1_musig_ge_serialize_ext(auStack_360,&sStack_198);
    pcStack_3f8 = (code *)0x112033;
    secp256k1_sha256_write((secp256k1_sha256 *)&sStack_130,auStack_360,0x21);
    pcStack_3f8 = (code *)0x112045;
    secp256k1_sha256_write((secp256k1_sha256 *)&sStack_130,auStack_3c0 + 0x20,0x20);
    pcStack_3f8 = (code *)0x112055;
    secp256k1_sha256_write((secp256k1_sha256 *)&sStack_130,(uchar *)in_RCX,0x20);
    pcStack_3f8 = (code *)0x112062;
    secp256k1_sha256_finalize((secp256k1_sha256 *)&sStack_130,abStack_380);
    lVar9 = 0;
    psVar17 = (secp256k1_scalar *)0x0;
    do {
      uVar10 = (uint)abStack_380[lVar9] | (int)psVar17 << 8;
      keypair = (uchar *)(ulong)uVar10;
      uStack_3cc = uVar10 - (uVar10 / 0xd + (uVar10 / 0xd) * 0xc);
      if (uVar10 < 0xd) {
        uStack_3cc = uVar10;
      }
      psVar17 = (secp256k1_scalar *)(ulong)uStack_3cc;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x20);
    pcStack_3f8 = (code *)0x11209d;
    secp256k1_scalar_verify(psVar17);
    pcStack_3f8 = (code *)0x1120b8;
    secp256k1_effective_nonce(&sStack_130,&sStack_200,&uStack_3cc);
    pcStack_3f8 = (code *)0x1120cb;
    secp256k1_ge_set_gej((secp256k1_ge *)auStack_360,&sStack_130);
    pcStack_3f8 = (code *)0x1120d3;
    secp256k1_ge_verify((secp256k1_ge *)auStack_360);
    if (iStack_300 != 0) {
      psVar14 = &secp256k1_ge_const_g;
      puVar18 = (uint64_t *)auStack_360;
      for (keypair = (uchar *)0xd; (secp256k1_keypair *)keypair != (secp256k1_keypair *)0x0;
          keypair = keypair + -1) {
        *puVar18 = (psVar14->x).n[0];
        psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar21 * -2 + 1) * 8);
        puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
      }
    }
    psVar15 = (secp256k1_fe *)auStack_360;
    pcStack_3f8 = (code *)0x112101;
    secp256k1_fe_normalize_var(psVar15);
    pcStack_3f8 = (code *)0x11210e;
    secp256k1_fe_get_b32(auStack_3c0,psVar15);
    psVar16 = (secp256k1_context *)(auStack_360 + 0x30);
    pcStack_3f8 = (code *)0x11211e;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar16);
    pcStack_3f8 = (code *)0x112126;
    psVar19 = psVar16;
    secp256k1_fe_verify((secp256k1_fe *)psVar16);
    if (iStack_304 != 0) {
      uStack_3f0 = auStack_360._48_4_ & 1;
      psVar15 = (secp256k1_fe *)auStack_3c0;
      in_R8 = (secp256k1_musig_keyagg_cache *)(auStack_3c0 + 0x20);
      pcStack_3f8 = (code *)0x11215e;
      secp256k1_schnorrsig_challenge
                (&uStack_3c8,(uchar *)psVar15,(uchar *)in_RCX,0x20,(uchar *)in_R8);
      uStack_3c4 = 0;
      pcStack_3f8 = (code *)0x112176;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_208);
      uVar10 = uStack_3c4;
      if (uStack_208 != 0) {
        pcStack_3f8 = (code *)0x112184;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_3c8);
        pcStack_3f8 = (code *)0x11218c;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_208);
        uStack_208 = uStack_208 * uStack_3c8;
        keypair = (uchar *)(ulong)((uStack_208 / 0xd) * 3);
        uVar10 = uStack_208 - (uStack_208 / 0xd + (uStack_208 / 0xd) * 0xc);
        in_RCX = (secp256k1_scalar *)(ulong)uVar10;
        pcStack_3f8 = (code *)0x1121ae;
        secp256k1_scalar_verify(in_RCX);
        psVar16 = (secp256k1_context *)(auStack_2f8 + 0x30);
        pcStack_3f8 = (code *)0x1121be;
        psVar19 = psVar16;
        secp256k1_fe_verify((secp256k1_fe *)psVar16);
        if (iStack_29c == 0) goto LAB_001122d2;
        if ((auStack_2f8[0x30] & 1) != 0) {
          pcStack_3f8 = (code *)0x1121db;
          secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
          uVar12 = 0xd - uVar10;
          if (uVar10 == 0) {
            uVar12 = uVar10;
          }
          pcStack_3f8 = (code *)0x1121f1;
          secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar12);
          uVar10 = uVar12;
        }
      }
      uStack_3c4 = uVar10;
      uStack_3dc = auStack_3c0._16_8_;
      uStack_3d4 = auStack_3c0._24_8_;
      uStack_3ec = auStack_3c0._0_8_;
      uStack_3e4 = auStack_3c0._8_8_;
      (psVar13->ecmult_gen_ctx).built = 0x17e9ed9d;
      *(undefined1 *)&(psVar13->ecmult_gen_ctx).scalar_offset = (undefined1)uStack_3f0;
      *(undefined8 *)((long)&(psVar13->ecmult_gen_ctx).scalar_offset + 1) = auStack_3c0._0_8_;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.x.n + 5) = auStack_3c0._8_8_;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.x.n + 0xd) = auStack_3c0._16_8_;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.x.n + 0x15) = auStack_3c0._24_8_;
      pcStack_3f8 = (code *)0x112234;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_3cc);
      *(undefined8 *)((long)&(psVar13->ecmult_gen_ctx).ge_offset.x.magnitude + 1) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.y.n + 1) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.x.n + 0x1d) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.x.n + 0x25) = 0;
      *(uint *)((long)(psVar13->ecmult_gen_ctx).ge_offset.y.n + 9) =
           uStack_3cc >> 0x18 | (uStack_3cc & 0xff0000) >> 8 | (uStack_3cc & 0xff00) << 8 |
           uStack_3cc << 0x18;
      pcStack_3f8 = (code *)0x112251;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_3c8);
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.y.n + 0x19) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.y.n + 0x21) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.y.n + 0xd) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).ge_offset.y.n + 0x15) = 0;
      *(uint *)((long)&(psVar13->ecmult_gen_ctx).ge_offset.y.magnitude + 1) =
           uStack_3c8 >> 0x18 | (uStack_3c8 & 0xff0000) >> 8 | (uStack_3c8 & 0xff00) << 8 |
           uStack_3c8 << 0x18;
      pcStack_3f8 = (code *)0x11226e;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_3c4);
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).proj_blind.n + 1) = 0;
      *(undefined8 *)((long)(psVar13->ecmult_gen_ctx).proj_blind.n + 9) = 0;
      *(undefined8 *)((long)&(psVar13->ecmult_gen_ctx).ge_offset.y.normalized + 1) = 0;
      *(undefined8 *)&(psVar13->ecmult_gen_ctx).ge_offset.field_0x65 = 0;
      *(uint *)((long)(psVar13->ecmult_gen_ctx).proj_blind.n + 0x11) =
           uStack_3c4 >> 0x18 | (uStack_3c4 & 0xff0000) >> 8 | (uStack_3c4 & 0xff00) << 8 |
           uStack_3c4 << 0x18;
      return;
    }
    pcStack_3f8 = (code *)0x1122d2;
    secp256k1_musig_nonce_process_cold_2();
LAB_001122d2:
    pcStack_3f8 = secp256k1_musig_partial_sign;
    secp256k1_musig_nonce_process_cold_1();
    pcStack_3f8 = (code *)0x0;
    psStack_420 = psVar13;
    psStack_418 = &sStack_130;
    puStack_410 = auStack_360;
    psStack_408 = in_RCX;
    psStack_400 = psVar16;
    if (psVar19 == (secp256k1_context *)0x0) {
      secp256k1_musig_partial_sign_cold_9();
    }
    else if (__s != (void *)0x0) {
      lVar9 = 0;
      do {
        if (*(uchar *)((long)__s + lVar9) != secp256k1_musig_secnonce_magic[lVar9]) {
          (*(psVar19->illegal_callback).fn)
                    ("secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0"
                     ,(psVar19->illegal_callback).data);
          goto LAB_0011273e;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      auVar22[0] = -((*(char *)((long)__s + 0x34) == '\0' && *(char *)((long)__s + 0x24) == '\0') &&
                    (*(char *)((long)__s + 0x14) == '\0' && *(char *)((long)__s + 4) == '\0'));
      auVar22[1] = -((*(char *)((long)__s + 0x35) == '\0' && *(char *)((long)__s + 0x25) == '\0') &&
                    (*(char *)((long)__s + 0x15) == '\0' && *(char *)((long)__s + 5) == '\0'));
      auVar22[2] = -((*(char *)((long)__s + 0x36) == '\0' && *(char *)((long)__s + 0x26) == '\0') &&
                    (*(char *)((long)__s + 0x16) == '\0' && *(char *)((long)__s + 6) == '\0'));
      auVar22[3] = -((*(char *)((long)__s + 0x37) == '\0' && *(char *)((long)__s + 0x27) == '\0') &&
                    (*(char *)((long)__s + 0x17) == '\0' && *(char *)((long)__s + 7) == '\0'));
      auVar22[4] = -((*(char *)((long)__s + 0x38) == '\0' && *(char *)((long)__s + 0x28) == '\0') &&
                    (*(char *)((long)__s + 0x18) == '\0' && *(char *)((long)__s + 8) == '\0'));
      auVar22[5] = -((*(char *)((long)__s + 0x39) == '\0' && *(char *)((long)__s + 0x29) == '\0') &&
                    (*(char *)((long)__s + 0x19) == '\0' && *(char *)((long)__s + 9) == '\0'));
      auVar22[6] = -((*(char *)((long)__s + 0x3a) == '\0' && *(char *)((long)__s + 0x2a) == '\0') &&
                    (*(char *)((long)__s + 0x1a) == '\0' && *(char *)((long)__s + 10) == '\0'));
      auVar22[7] = -((*(char *)((long)__s + 0x3b) == '\0' && *(char *)((long)__s + 0x2b) == '\0') &&
                    (*(char *)((long)__s + 0x1b) == '\0' && *(char *)((long)__s + 0xb) == '\0'));
      auVar22[8] = -((*(char *)((long)__s + 0x3c) == '\0' && *(char *)((long)__s + 0x2c) == '\0') &&
                    (*(char *)((long)__s + 0x1c) == '\0' && *(char *)((long)__s + 0xc) == '\0'));
      auVar22[9] = -((*(char *)((long)__s + 0x3d) == '\0' && *(char *)((long)__s + 0x2d) == '\0') &&
                    (*(char *)((long)__s + 0x1d) == '\0' && *(char *)((long)__s + 0xd) == '\0'));
      auVar22[10] = -((*(char *)((long)__s + 0x3e) == '\0' && *(char *)((long)__s + 0x2e) == '\0')
                     && (*(char *)((long)__s + 0x1e) == '\0' && *(char *)((long)__s + 0xe) == '\0'))
      ;
      auVar22[0xb] = -((*(char *)((long)__s + 0x3f) == '\0' && *(char *)((long)__s + 0x2f) == '\0')
                      && (*(char *)((long)__s + 0x1f) == '\0' && *(char *)((long)__s + 0xf) == '\0')
                      );
      auVar22[0xc] = -((*(char *)((long)__s + 0x40) == '\0' && *(char *)((long)__s + 0x30) == '\0')
                      && (*(char *)((long)__s + 0x20) == '\0' && *(char *)((long)__s + 0x10) == '\0'
                         ));
      auVar22[0xd] = -((*(char *)((long)__s + 0x41) == '\0' && *(char *)((long)__s + 0x31) == '\0')
                      && (*(char *)((long)__s + 0x21) == '\0' && *(char *)((long)__s + 0x11) == '\0'
                         ));
      auVar22[0xe] = -((*(char *)((long)__s + 0x42) == '\0' && *(char *)((long)__s + 0x32) == '\0')
                      && (*(char *)((long)__s + 0x22) == '\0' && *(char *)((long)__s + 0x12) == '\0'
                         ));
      auVar22[0xf] = -((*(char *)((long)__s + 0x43) == '\0' && *(char *)((long)__s + 0x33) == '\0')
                      && (*(char *)((long)__s + 0x23) == '\0' && *(char *)((long)__s + 0x13) == '\0'
                         ));
      sStack_518.pk.x.n[1] = (uint64_t)auStack_618;
      auStack_618._0_4_ = auStack_618._0_4_ & 0xffffff00;
      sStack_518.pk.x.n[0] = 0x4d430001;
      sStack_518.pk.x.n[2] = 1;
      sStack_580.x.n[0]._0_4_ =
           (uint)((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
      if (psVar19->declassify != 0) {
        sStack_518.pk.x.n[0] = 0x4d430002;
        sStack_518.pk.x.n[1] = (uint64_t)&sStack_580;
        sStack_518.pk.x.n[2] = 4;
      }
      sStack_518.pk.x.magnitude = 0;
      sStack_518.pk.x.normalized = 0;
      sStack_518.pk.x.n[4] = 0;
      sStack_518.pk.x.n[3] = 0;
      auStack_618._48_8_ = 0;
      if ((uint)sStack_580.x.n[0] == 0) {
        psVar17 = (secp256k1_scalar *)0x0;
        lVar9 = 4;
        do {
          uVar10 = (uint)*(byte *)((long)__s + lVar9) | (int)psVar17 << 8;
          uStack_630 = uVar10 - (uVar10 / 0xd + (uVar10 / 0xd) * 0xc);
          if (uVar10 < 0xd) {
            uStack_630 = uVar10;
          }
          psVar17 = (secp256k1_scalar *)(ulong)uStack_630;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x24);
        psStack_628 = psVar15;
        secp256k1_scalar_verify(psVar17);
        psVar17 = (secp256k1_scalar *)0x0;
        lVar9 = 0x24;
        do {
          uVar10 = (uint)*(byte *)((long)__s + lVar9) | (int)psVar17 << 8;
          uStack_62c = uVar10 - (uVar10 / 0xd + (uVar10 / 0xd) * 0xc);
          if (uVar10 < 0xd) {
            uStack_62c = uVar10;
          }
          psVar17 = (secp256k1_scalar *)(ulong)uStack_62c;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x44);
        secp256k1_scalar_verify(psVar17);
        sStack_518.pk.x.n[0] = *(uint64_t *)((long)__s + 0x44);
        sStack_518.pk.x.n[1] = *(uint64_t *)((long)__s + 0x4c);
        sStack_518.pk.x.n[2] = *(uint64_t *)((long)__s + 0x54);
        sStack_518.pk.x.n[3] = *(uint64_t *)((long)__s + 0x5c);
        sStack_518.pk.x.n[4] = *(uint64_t *)((long)__s + 100);
        sStack_518.pk.x._40_8_ = *(undefined8 *)((long)__s + 0x6c);
        sStack_518.pk.y.n[0] = *(uint64_t *)((long)__s + 0x74);
        sStack_518.pk.y.n[1] = *(uint64_t *)((long)__s + 0x7c);
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)(auStack_618 + 0x30),(secp256k1_ge_storage *)&sStack_518);
        memset(__s,0,0x84);
        if (psStack_628 == (secp256k1_fe *)0x0) {
          secp256k1_musig_partial_sign_cold_7();
          return;
        }
        if ((secp256k1_keypair *)keypair == (secp256k1_keypair *)0x0) {
          secp256k1_musig_partial_sign_cold_6();
          return;
        }
        if (in_R8 != (secp256k1_musig_keyagg_cache *)0x0) {
          if (in_R9 == (secp256k1_musig_session *)0x0) {
            secp256k1_musig_partial_sign_cold_4();
            return;
          }
          iVar8 = secp256k1_keypair_load
                            (psVar19,&uStack_634,&sStack_580,(secp256k1_keypair *)keypair);
          if (iVar8 != 0) {
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)(auStack_618 + 0x30),&sStack_580.x);
            if ((iVar8 == 0) || (iVar8 = secp256k1_fe_equal(&sStack_5b8,&sStack_580.y), iVar8 == 0))
            {
              secp256k1_musig_partial_sign_cold_3();
              return;
            }
            cache_i = &sStack_518;
            iVar8 = secp256k1_keyagg_cache_load(psVar19,cache_i,in_R8);
            if (iVar8 != 0) {
              psVar15 = &sStack_518.pk.y;
              secp256k1_fe_verify(psVar15);
              if (sStack_518.pk.y.normalized == 0) {
                secp256k1_musig_partial_sign_cold_2();
                *(undefined4 *)psVar15->n = 0;
                *(undefined4 *)(cache_i->pk).x.n = 0;
                *(undefined4 *)((long)(cache_i->pk).x.n + 4) = 0;
                return;
              }
              if (((uint)sStack_518.pk.y.n[0] & 1) != sStack_518.parity_acc) {
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_634);
                uVar10 = 0xd - uStack_634;
                if (uStack_634 == 0) {
                  uVar10 = 0;
                }
                uStack_634 = uVar10;
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
              }
              secp256k1_musig_keyaggcoef_internal
                        (&uStack_61c,sStack_518.pks_hash,(secp256k1_ge *)(auStack_618 + 0x30),
                         &sStack_518.second_pk);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_634);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_61c);
              uStack_61c = uStack_61c * uStack_634;
              uStack_634 = uStack_61c - (uStack_61c / 0xd + (uStack_61c / 0xd) * 0xc);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_634);
              iVar8 = secp256k1_musig_session_load
                                (psVar19,(secp256k1_musig_session_internal *)auStack_618,in_R9);
              if (iVar8 != 0) {
                if (auStack_618._0_4_ != 0) {
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_630);
                  uVar10 = 0xd - uStack_630;
                  if (uStack_630 == 0) {
                    uVar10 = 0;
                  }
                  uStack_630 = uVar10;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_62c);
                  uVar10 = 0xd - uStack_62c;
                  if (uStack_62c == 0) {
                    uVar10 = 0;
                  }
                  uStack_62c = uVar10;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
                }
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)auStack_618._40_4_);
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_634);
                uStack_620 = auStack_618._40_4_ * uStack_634;
                uStack_620 = uStack_620 - (uStack_620 / 0xd + (uStack_620 / 0xd) * 0xc);
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_620);
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)auStack_618._36_4_);
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_62c);
                uStack_62c = auStack_618._36_4_ * uStack_62c;
                uStack_62c = uStack_62c - (uStack_62c / 0xd + (uStack_62c / 0xd) * 0xc);
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_62c);
                secp256k1_scalar_add(&uStack_630,&uStack_630,&uStack_62c);
                secp256k1_scalar_add(&uStack_620,&uStack_620,&uStack_630);
                uVar10 = uStack_620;
                psVar15 = psStack_628;
                *(undefined4 *)psStack_628->n = 0x321afbeb;
                secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_620);
                psVar15->n[2] = 0;
                psVar15->n[3] = 0;
                *(undefined1 (*) [16])((long)psVar15->n + 4) = (undefined1  [16])0x0;
                *(uint *)(psVar15->n + 4) =
                     uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 << 0x18;
                secp256k1_musig_partial_sign_clear(&uStack_634,&uStack_630);
                return;
              }
            }
          }
          secp256k1_musig_partial_sign_clear(&uStack_634,&uStack_630);
          return;
        }
        secp256k1_musig_partial_sign_cold_5();
        return;
      }
      secp256k1_musig_partial_sign_cold_1();
LAB_0011273e:
      memset(__s,0,0x84);
      secp256k1_musig_partial_sign_clear(&uStack_634,&uStack_630);
      return;
    }
    secp256k1_musig_partial_sign_cold_8();
    return;
  }
  pcStack_3f8 = (code *)0x1122ab;
  secp256k1_musig_nonce_process_cold_6();
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}